

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LabelFinder.cpp
# Opt level: O3

void __thiscall Saturation::LabelFinder::onNewPropositionalClause(LabelFinder *this,Clause *cl)

{
  uint uVar1;
  bool bVar2;
  uint *puVar3;
  
  bVar2 = Kernel::MainLoop::isRefutation(cl);
  if (!bVar2) {
    bVar2 = Kernel::Clause::noSplits(cl);
    if (((bVar2) && ((*(uint *)&cl->field_0x38 & 0xffffe) == 0)) &&
       (uVar1 = (cl->_literals[0]->super_Term)._functor,
       (*(byte *)(*(long *)(*(long *)(DAT_00b521b0 + 0x80) + (ulong)uVar1 * 8) + 0x40) & 0x20) != 0)
       ) {
      puVar3 = (this->_foundLabels)._cursor;
      if (puVar3 == (this->_foundLabels)._end) {
        Lib::Stack<unsigned_int>::expand(&this->_foundLabels);
        puVar3 = (this->_foundLabels)._cursor;
      }
      *puVar3 = uVar1;
      (this->_foundLabels)._cursor = puVar3 + 1;
    }
  }
  return;
}

Assistant:

void LabelFinder::onNewPropositionalClause(Clause* cl)
{
  ASS(cl);
  // if we found a refutation ignore it
  if(Kernel::MainLoop::isRefutation(cl)) return;

  // Currently don't know what to do if conditional
  if(!cl->noSplits()) {
    return;
  }
  // Just looking for unit clauses
  if(cl->size() > 1){
    return;
  }

  unsigned predicate = (*cl)[0]->functor();

  // Looking for predicates
  ASS(env.signature->getPredicate(predicate));
  if(!env.signature->getPredicate(predicate)->label()){
    return;
  }

  _foundLabels.push(predicate);
}